

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::LayerParameter::Clear(LayerParameter *this)

{
  byte bVar1;
  uint uVar2;
  string *psVar3;
  DropoutParameter *pDVar4;
  HingeLossParameter *pHVar5;
  SigmoidParameter *pSVar6;
  TanHParameter *pTVar7;
  ThresholdParameter *pTVar8;
  ELUParameter *pEVar9;
  CropParameter *pCVar10;
  LogMessage *pLVar11;
  LogFinisher local_ad9;
  LogMessage local_ad8;
  LogMessage local_aa0;
  LogMessage local_a68;
  LogMessage local_a30;
  LogMessage local_9f8;
  LogMessage local_9c0;
  LogMessage local_988;
  LogMessage local_950;
  LogMessage local_918;
  LogMessage local_8e0;
  LogMessage local_8a8;
  LogMessage local_870;
  LogMessage local_838;
  LogMessage local_800;
  LogMessage local_7c8;
  LogMessage local_790;
  LogMessage local_758;
  LogMessage local_720;
  LogMessage local_6e8;
  LogMessage local_6b0;
  LogMessage local_678;
  LogMessage local_640;
  LogMessage local_608;
  LogMessage local_5d0;
  LogMessage local_598;
  LogMessage local_560;
  LogMessage local_528;
  LogMessage local_4f0;
  LogMessage local_4b8;
  LogMessage local_480;
  LogMessage local_448;
  LogMessage local_410;
  LogMessage local_3d8;
  LogMessage local_3a0;
  LogMessage local_368;
  LogMessage local_330;
  LogMessage local_2f8;
  LogMessage local_2c0;
  LogMessage local_288;
  LogMessage local_250;
  LogMessage local_218;
  LogMessage local_1e0;
  LogMessage local_1a8;
  LogMessage local_170;
  LogMessage local_138;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase);
  (this->loss_weight_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase);
  (this->propagate_down_).current_size_ = 0;
  bVar1 = (byte)(this->_has_bits_).has_bits_[0];
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      if ((this->name_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x31fb);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_58,
                             "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                            );
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_58);
      }
      psVar3 = (this->name_).ptr_;
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      if ((this->type_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x31ff);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_90,
                             "CHECK failed: !type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                            );
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_90);
      }
      psVar3 = (this->type_).ptr_;
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 4) != 0) {
      if (this->transform_param_ == (TransformationParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3203);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_c8,"CHECK failed: transform_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_100,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      }
      TransformationParameter::Clear(this->transform_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 8) != 0) {
      if (this->loss_param_ == (LossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_100,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3207);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_100,"CHECK failed: loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_100);
      }
      LossParameter::Clear(this->loss_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x10) != 0) {
      if (this->accuracy_param_ == (AccuracyParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x320b);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_138,"CHECK failed: accuracy_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_170,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_138);
      }
      AccuracyParameter::Clear(this->accuracy_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x20) != 0) {
      if (this->argmax_param_ == (ArgMaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_170,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x320f);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_170,"CHECK failed: argmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_170);
      }
      ArgMaxParameter::Clear(this->argmax_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x40) != 0) {
      if (this->concat_param_ == (ConcatParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3213);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1a8,"CHECK failed: concat_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1a8);
      }
      ConcatParameter::Clear(this->concat_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x80) != 0) {
      if (this->contrastive_loss_param_ == (ContrastiveLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3217);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1e0,"CHECK failed: contrastive_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1e0);
      }
      ContrastiveLossParameter::Clear(this->contrastive_loss_param_);
    }
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      if (this->convolution_param_ == (ConvolutionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_218,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x321d);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_218,"CHECK failed: convolution_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_250,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_218);
      }
      ConvolutionParameter::Clear(this->convolution_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x200) != 0) {
      if (this->data_param_ == (DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_250,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3221);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_250,"CHECK failed: data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_250);
      }
      DataParameter::Clear(this->data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x400) != 0) {
      if (this->dropout_param_ == (DropoutParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_288,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3225);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_288,"CHECK failed: dropout_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2c0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_288);
      }
      pDVar4 = this->dropout_param_;
      pDVar4->dropout_ratio_ = 0.5;
      (pDVar4->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pDVar4->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pDVar4->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x800) != 0) {
      if (this->dummy_data_param_ == (DummyDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3229);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_2c0,"CHECK failed: dummy_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_2c0);
      }
      DummyDataParameter::Clear(this->dummy_data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x1000) != 0) {
      if (this->eltwise_param_ == (EltwiseParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x322d);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_2f8,"CHECK failed: eltwise_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_330,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_2f8);
      }
      EltwiseParameter::Clear(this->eltwise_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x2000) != 0) {
      if (this->exp_param_ == (ExpParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_330,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3231);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_330,"CHECK failed: exp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_368,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_330);
      }
      ExpParameter::Clear(this->exp_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x4000) != 0) {
      if (this->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_368,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3235);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_368,"CHECK failed: hdf5_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_368);
      }
      HDF5DataParameter::Clear(this->hdf5_data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x8000) != 0) {
      if (this->hdf5_output_param_ == (HDF5OutputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_3a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3239);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_3a0,"CHECK failed: hdf5_output_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3d8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_3a0);
      }
      HDF5OutputParameter::Clear(this->hdf5_output_param_);
    }
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0xff0000) != 0) {
    if ((uVar2 >> 0x10 & 1) != 0) {
      if (this->hinge_loss_param_ == (HingeLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_3d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x323f);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_3d8,"CHECK failed: hinge_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_410,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_3d8);
      }
      pHVar5 = this->hinge_loss_param_;
      pHVar5->norm_ = 1;
      (pHVar5->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pHVar5->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pHVar5->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x20000) != 0) {
      if (this->image_data_param_ == (ImageDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_410,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3243);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_410,"CHECK failed: image_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_448,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_410);
      }
      ImageDataParameter::Clear(this->image_data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x40000) != 0) {
      if (this->infogain_loss_param_ == (InfogainLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_448,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3247);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_448,"CHECK failed: infogain_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_480,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_448);
      }
      InfogainLossParameter::Clear(this->infogain_loss_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x80000) != 0) {
      if (this->inner_product_param_ == (InnerProductParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_480,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x324b);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_480,"CHECK failed: inner_product_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_4b8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_480);
      }
      InnerProductParameter::Clear(this->inner_product_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x100000) != 0) {
      if (this->lrn_param_ == (LRNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_4b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x324f);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_4b8,"CHECK failed: lrn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_4f0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_4b8);
      }
      LRNParameter::Clear(this->lrn_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x200000) != 0) {
      if (this->memory_data_param_ == (MemoryDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_4f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3253);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_4f0,"CHECK failed: memory_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_528,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_4f0);
      }
      MemoryDataParameter::Clear(this->memory_data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x400000) != 0) {
      if (this->mvn_param_ == (MVNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_528,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3257);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_528,"CHECK failed: mvn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_560,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_528);
      }
      MVNParameter::Clear(this->mvn_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x800000) != 0) {
      if (this->pooling_param_ == (PoolingParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_560,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x325b);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_560,"CHECK failed: pooling_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_598,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_560);
      }
      PoolingParameter::Clear(this->pooling_param_);
    }
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if (0xffffff < uVar2) {
    if ((uVar2 >> 0x18 & 1) != 0) {
      if (this->power_param_ == (PowerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_598,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3261);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_598,"CHECK failed: power_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_5d0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_598);
      }
      PowerParameter::Clear(this->power_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x2000000) != 0) {
      if (this->relu_param_ == (ReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_5d0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3265);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_5d0,"CHECK failed: relu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_608,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_5d0);
      }
      ReLUParameter::Clear(this->relu_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x4000000) != 0) {
      if (this->sigmoid_param_ == (SigmoidParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_608,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3269);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_608,"CHECK failed: sigmoid_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_640,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_608);
      }
      pSVar6 = this->sigmoid_param_;
      pSVar6->engine_ = 0;
      (pSVar6->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pSVar6->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pSVar6->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x8000000) != 0) {
      if (this->softmax_param_ == (SoftmaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_640,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x326d);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_640,"CHECK failed: softmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_678,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_640);
      }
      SoftmaxParameter::Clear(this->softmax_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x10000000) != 0) {
      if (this->slice_param_ == (SliceParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_678,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3271);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_678,"CHECK failed: slice_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_6b0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_678);
      }
      SliceParameter::Clear(this->slice_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x20000000) != 0) {
      if (this->tanh_param_ == (TanHParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_6b0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3275);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_6b0,"CHECK failed: tanh_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_6e8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_6b0);
      }
      pTVar7 = this->tanh_param_;
      pTVar7->engine_ = 0;
      (pTVar7->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pTVar7->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pTVar7->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x40000000) != 0) {
      if (this->threshold_param_ == (ThresholdParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_6e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3279);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_6e8,"CHECK failed: threshold_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_720,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_6e8);
      }
      pTVar8 = this->threshold_param_;
      pTVar8->threshold_ = 0.0;
      (pTVar8->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pTVar8->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pTVar8->_internal_metadata_)
        ;
      }
    }
    if ((int)(this->_has_bits_).has_bits_[0] < 0) {
      if (this->window_data_param_ == (WindowDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_720,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x327d);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_720,"CHECK failed: window_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_758,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_720);
      }
      WindowDataParameter::Clear(this->window_data_param_);
    }
  }
  if ((char)(this->_has_bits_).has_bits_[1] != '\0') {
    if (((this->_has_bits_).has_bits_[1] & 1) != 0) {
      if (this->python_param_ == (PythonParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_758,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3283);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_758,"CHECK failed: python_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_790,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_758);
      }
      PythonParameter::Clear(this->python_param_);
    }
    if (((this->_has_bits_).has_bits_[1] & 2) != 0) {
      if (this->prelu_param_ == (PReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_790,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3287);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_790,"CHECK failed: prelu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_7c8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_790);
      }
      PReLUParameter::Clear(this->prelu_param_);
    }
    if (((this->_has_bits_).has_bits_[1] & 4) != 0) {
      if (this->spp_param_ == (SPPParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_7c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x328b);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_7c8,"CHECK failed: spp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_800,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_7c8);
      }
      SPPParameter::Clear(this->spp_param_);
    }
    if (((this->_has_bits_).has_bits_[1] & 8) != 0) {
      if (this->reshape_param_ == (ReshapeParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_800,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x328f);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_800,"CHECK failed: reshape_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_838,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_800);
      }
      ReshapeParameter::Clear(this->reshape_param_);
    }
    if (((this->_has_bits_).has_bits_[1] & 0x10) != 0) {
      if (this->log_param_ == (LogParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_838,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3293);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_838,"CHECK failed: log_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_870,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_838);
      }
      LogParameter::Clear(this->log_param_);
    }
    if (((this->_has_bits_).has_bits_[1] & 0x20) != 0) {
      if (this->flatten_param_ == (FlattenParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_870,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3297);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_870,"CHECK failed: flatten_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_8a8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_870);
      }
      FlattenParameter::Clear(this->flatten_param_);
    }
    if (((this->_has_bits_).has_bits_[1] & 0x40) != 0) {
      if (this->reduction_param_ == (ReductionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_8a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x329b);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_8a8,"CHECK failed: reduction_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_8e0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_8a8);
      }
      ReductionParameter::Clear(this->reduction_param_);
    }
    if (((this->_has_bits_).has_bits_[1] & 0x80) != 0) {
      if (this->embed_param_ == (EmbedParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_8e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x329f);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_8e0,"CHECK failed: embed_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_918,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_8e0);
      }
      EmbedParameter::Clear(this->embed_param_);
    }
  }
  if (*(char *)((long)(this->_has_bits_).has_bits_ + 5) != '\0') {
    if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 5) & 1) != 0) {
      if (this->tile_param_ == (TileParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_918,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32a5);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_918,"CHECK failed: tile_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_950,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_918);
      }
      TileParameter::Clear(this->tile_param_);
    }
    if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 5) & 2) != 0) {
      if (this->batch_norm_param_ == (BatchNormParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_950,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32a9);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_950,"CHECK failed: batch_norm_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_988,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_950);
      }
      BatchNormParameter::Clear(this->batch_norm_param_);
    }
    if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 5) & 4) != 0) {
      if (this->elu_param_ == (ELUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_988,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32ad);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_988,"CHECK failed: elu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_9c0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_988);
      }
      pEVar9 = this->elu_param_;
      pEVar9->alpha_ = 1.0;
      (pEVar9->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pEVar9->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pEVar9->_internal_metadata_)
        ;
      }
    }
    if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 5) & 8) != 0) {
      if (this->bias_param_ == (BiasParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_9c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b1);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_9c0,"CHECK failed: bias_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_9f8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_9c0);
      }
      BiasParameter::Clear(this->bias_param_);
    }
    if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 5) & 0x10) != 0) {
      if (this->scale_param_ == (ScaleParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_9f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b5);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_9f8,"CHECK failed: scale_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a30,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_9f8);
      }
      ScaleParameter::Clear(this->scale_param_);
    }
    if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 5) & 0x20) != 0) {
      if (this->input_param_ == (InputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a30,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b9);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_a30,"CHECK failed: input_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a68,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a30);
      }
      InputParameter::Clear(this->input_param_);
    }
    if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 5) & 0x40) != 0) {
      if (this->crop_param_ == (CropParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32bd);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_a68,"CHECK failed: crop_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_aa0,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a68);
      }
      pCVar10 = this->crop_param_;
      (pCVar10->offset_).current_size_ = 0;
      pCVar10->axis_ = 2;
      (pCVar10->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pCVar10->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear
                  (&pCVar10->_internal_metadata_);
      }
    }
    if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 5) & 0x80) != 0) {
      if (this->parameter_param_ == (ParameterParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_aa0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32c1);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            (&local_aa0,"CHECK failed: parameter_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_ad8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage(&local_aa0);
      }
      ParameterParameter::Clear(this->parameter_param_);
    }
  }
  if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 6) & 1) != 0) {
    if (this->recurrent_param_ == (RecurrentParameter *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_ad8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x32c6);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<
                          (&local_ad8,"CHECK failed: recurrent_param_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(&local_ad9,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_ad8);
    }
    RecurrentParameter::Clear(this->recurrent_param_);
  }
  this->phase_ = 0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void LayerParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.LayerParameter)
  bottom_.Clear();
  top_.Clear();
  loss_weight_.Clear();
  param_.Clear();
  blobs_.Clear();
  include_.Clear();
  exclude_.Clear();
  propagate_down_.Clear();
  if (_has_bits_[0 / 32] & 255u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_type()) {
      GOOGLE_DCHECK(!type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*type_.UnsafeRawStringPointer())->clear();
    }
    if (has_transform_param()) {
      GOOGLE_DCHECK(transform_param_ != NULL);
      transform_param_->::caffe::TransformationParameter::Clear();
    }
    if (has_loss_param()) {
      GOOGLE_DCHECK(loss_param_ != NULL);
      loss_param_->::caffe::LossParameter::Clear();
    }
    if (has_accuracy_param()) {
      GOOGLE_DCHECK(accuracy_param_ != NULL);
      accuracy_param_->::caffe::AccuracyParameter::Clear();
    }
    if (has_argmax_param()) {
      GOOGLE_DCHECK(argmax_param_ != NULL);
      argmax_param_->::caffe::ArgMaxParameter::Clear();
    }
    if (has_concat_param()) {
      GOOGLE_DCHECK(concat_param_ != NULL);
      concat_param_->::caffe::ConcatParameter::Clear();
    }
    if (has_contrastive_loss_param()) {
      GOOGLE_DCHECK(contrastive_loss_param_ != NULL);
      contrastive_loss_param_->::caffe::ContrastiveLossParameter::Clear();
    }
  }
  if (_has_bits_[8 / 32] & 65280u) {
    if (has_convolution_param()) {
      GOOGLE_DCHECK(convolution_param_ != NULL);
      convolution_param_->::caffe::ConvolutionParameter::Clear();
    }
    if (has_data_param()) {
      GOOGLE_DCHECK(data_param_ != NULL);
      data_param_->::caffe::DataParameter::Clear();
    }
    if (has_dropout_param()) {
      GOOGLE_DCHECK(dropout_param_ != NULL);
      dropout_param_->::caffe::DropoutParameter::Clear();
    }
    if (has_dummy_data_param()) {
      GOOGLE_DCHECK(dummy_data_param_ != NULL);
      dummy_data_param_->::caffe::DummyDataParameter::Clear();
    }
    if (has_eltwise_param()) {
      GOOGLE_DCHECK(eltwise_param_ != NULL);
      eltwise_param_->::caffe::EltwiseParameter::Clear();
    }
    if (has_exp_param()) {
      GOOGLE_DCHECK(exp_param_ != NULL);
      exp_param_->::caffe::ExpParameter::Clear();
    }
    if (has_hdf5_data_param()) {
      GOOGLE_DCHECK(hdf5_data_param_ != NULL);
      hdf5_data_param_->::caffe::HDF5DataParameter::Clear();
    }
    if (has_hdf5_output_param()) {
      GOOGLE_DCHECK(hdf5_output_param_ != NULL);
      hdf5_output_param_->::caffe::HDF5OutputParameter::Clear();
    }
  }
  if (_has_bits_[16 / 32] & 16711680u) {
    if (has_hinge_loss_param()) {
      GOOGLE_DCHECK(hinge_loss_param_ != NULL);
      hinge_loss_param_->::caffe::HingeLossParameter::Clear();
    }
    if (has_image_data_param()) {
      GOOGLE_DCHECK(image_data_param_ != NULL);
      image_data_param_->::caffe::ImageDataParameter::Clear();
    }
    if (has_infogain_loss_param()) {
      GOOGLE_DCHECK(infogain_loss_param_ != NULL);
      infogain_loss_param_->::caffe::InfogainLossParameter::Clear();
    }
    if (has_inner_product_param()) {
      GOOGLE_DCHECK(inner_product_param_ != NULL);
      inner_product_param_->::caffe::InnerProductParameter::Clear();
    }
    if (has_lrn_param()) {
      GOOGLE_DCHECK(lrn_param_ != NULL);
      lrn_param_->::caffe::LRNParameter::Clear();
    }
    if (has_memory_data_param()) {
      GOOGLE_DCHECK(memory_data_param_ != NULL);
      memory_data_param_->::caffe::MemoryDataParameter::Clear();
    }
    if (has_mvn_param()) {
      GOOGLE_DCHECK(mvn_param_ != NULL);
      mvn_param_->::caffe::MVNParameter::Clear();
    }
    if (has_pooling_param()) {
      GOOGLE_DCHECK(pooling_param_ != NULL);
      pooling_param_->::caffe::PoolingParameter::Clear();
    }
  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    if (has_power_param()) {
      GOOGLE_DCHECK(power_param_ != NULL);
      power_param_->::caffe::PowerParameter::Clear();
    }
    if (has_relu_param()) {
      GOOGLE_DCHECK(relu_param_ != NULL);
      relu_param_->::caffe::ReLUParameter::Clear();
    }
    if (has_sigmoid_param()) {
      GOOGLE_DCHECK(sigmoid_param_ != NULL);
      sigmoid_param_->::caffe::SigmoidParameter::Clear();
    }
    if (has_softmax_param()) {
      GOOGLE_DCHECK(softmax_param_ != NULL);
      softmax_param_->::caffe::SoftmaxParameter::Clear();
    }
    if (has_slice_param()) {
      GOOGLE_DCHECK(slice_param_ != NULL);
      slice_param_->::caffe::SliceParameter::Clear();
    }
    if (has_tanh_param()) {
      GOOGLE_DCHECK(tanh_param_ != NULL);
      tanh_param_->::caffe::TanHParameter::Clear();
    }
    if (has_threshold_param()) {
      GOOGLE_DCHECK(threshold_param_ != NULL);
      threshold_param_->::caffe::ThresholdParameter::Clear();
    }
    if (has_window_data_param()) {
      GOOGLE_DCHECK(window_data_param_ != NULL);
      window_data_param_->::caffe::WindowDataParameter::Clear();
    }
  }
  if (_has_bits_[32 / 32] & 255u) {
    if (has_python_param()) {
      GOOGLE_DCHECK(python_param_ != NULL);
      python_param_->::caffe::PythonParameter::Clear();
    }
    if (has_prelu_param()) {
      GOOGLE_DCHECK(prelu_param_ != NULL);
      prelu_param_->::caffe::PReLUParameter::Clear();
    }
    if (has_spp_param()) {
      GOOGLE_DCHECK(spp_param_ != NULL);
      spp_param_->::caffe::SPPParameter::Clear();
    }
    if (has_reshape_param()) {
      GOOGLE_DCHECK(reshape_param_ != NULL);
      reshape_param_->::caffe::ReshapeParameter::Clear();
    }
    if (has_log_param()) {
      GOOGLE_DCHECK(log_param_ != NULL);
      log_param_->::caffe::LogParameter::Clear();
    }
    if (has_flatten_param()) {
      GOOGLE_DCHECK(flatten_param_ != NULL);
      flatten_param_->::caffe::FlattenParameter::Clear();
    }
    if (has_reduction_param()) {
      GOOGLE_DCHECK(reduction_param_ != NULL);
      reduction_param_->::caffe::ReductionParameter::Clear();
    }
    if (has_embed_param()) {
      GOOGLE_DCHECK(embed_param_ != NULL);
      embed_param_->::caffe::EmbedParameter::Clear();
    }
  }
  if (_has_bits_[40 / 32] & 65280u) {
    if (has_tile_param()) {
      GOOGLE_DCHECK(tile_param_ != NULL);
      tile_param_->::caffe::TileParameter::Clear();
    }
    if (has_batch_norm_param()) {
      GOOGLE_DCHECK(batch_norm_param_ != NULL);
      batch_norm_param_->::caffe::BatchNormParameter::Clear();
    }
    if (has_elu_param()) {
      GOOGLE_DCHECK(elu_param_ != NULL);
      elu_param_->::caffe::ELUParameter::Clear();
    }
    if (has_bias_param()) {
      GOOGLE_DCHECK(bias_param_ != NULL);
      bias_param_->::caffe::BiasParameter::Clear();
    }
    if (has_scale_param()) {
      GOOGLE_DCHECK(scale_param_ != NULL);
      scale_param_->::caffe::ScaleParameter::Clear();
    }
    if (has_input_param()) {
      GOOGLE_DCHECK(input_param_ != NULL);
      input_param_->::caffe::InputParameter::Clear();
    }
    if (has_crop_param()) {
      GOOGLE_DCHECK(crop_param_ != NULL);
      crop_param_->::caffe::CropParameter::Clear();
    }
    if (has_parameter_param()) {
      GOOGLE_DCHECK(parameter_param_ != NULL);
      parameter_param_->::caffe::ParameterParameter::Clear();
    }
  }
  if (has_recurrent_param()) {
    GOOGLE_DCHECK(recurrent_param_ != NULL);
    recurrent_param_->::caffe::RecurrentParameter::Clear();
  }
  phase_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}